

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O0

void __thiscall
aeron::ClientConductor::onAvailableCounter
          (ClientConductor *this,int64_t registrationId,int32_t counterId)

{
  bool bVar1;
  __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
  this_00;
  reference pCVar2;
  int32_t in_EDX;
  shared_ptr<aeron::Counter> *in_RDI;
  CounterStateDefn *state;
  __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
  counterIt;
  lock_guard<std::recursive_mutex> lock;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  uint __args_2;
  CountersReader *__args;
  anon_class_8_1_0d1909f2_for__M_pred in_stack_ffffffffffffff78;
  __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
  in_stack_ffffffffffffff80;
  __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
  in_stack_ffffffffffffff88;
  AtomicBuffer *in_stack_ffffffffffffff90;
  ClientConductor **in_stack_ffffffffffffff98;
  __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
  local_28 [2];
  int32_t local_14;
  
  local_14 = in_EDX;
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_RDI,
             (mutex_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  __args = (CountersReader *)
           &in_RDI[7].super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::
  vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
  ::begin((vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
           *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::
  vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
  ::end((vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
         *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  this_00 = std::
            find_if<__gnu_cxx::__normal_iterator<aeron::ClientConductor::CounterStateDefn*,std::vector<aeron::ClientConductor::CounterStateDefn,std::allocator<aeron::ClientConductor::CounterStateDefn>>>,aeron::ClientConductor::onAvailableCounter(long,int)::__0>
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78
                      );
  local_28[0] = this_00;
  std::
  vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
  ::end((vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
         *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
                      *)in_RDI,
                     (__normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  __args_2 = in_stack_ffffffffffffff5c & 0xffffff;
  if (bVar1) {
    pCVar2 = __gnu_cxx::
             __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
             ::operator*(local_28);
    __args_2 = CONCAT13(pCVar2->m_status == AWAITING_MEDIA_DRIVER,(int3)__args_2);
  }
  if ((char)(__args_2 >> 0x18) != '\0') {
    pCVar2 = __gnu_cxx::
             __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
             ::operator*(local_28);
    pCVar2->m_status = REGISTERED_MEDIA_DRIVER;
    pCVar2->m_counterId = local_14;
    std::
    make_shared<aeron::Counter,aeron::ClientConductor*,aeron::concurrent::AtomicBuffer&,long&,int&>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,(long *)in_RDI,
               (int *)in_stack_ffffffffffffff80._M_current);
    std::shared_ptr<aeron::Counter>::operator=
              (in_RDI,(shared_ptr<aeron::Counter> *)CONCAT44(__args_2,in_stack_ffffffffffffff58));
    std::shared_ptr<aeron::Counter>::~shared_ptr((shared_ptr<aeron::Counter> *)0x1c705d);
    std::weak_ptr<aeron::Counter>::weak_ptr<aeron::Counter,void>
              ((weak_ptr<aeron::Counter> *)in_RDI,
               (shared_ptr<aeron::Counter> *)CONCAT44(__args_2,in_stack_ffffffffffffff58));
    std::weak_ptr<aeron::Counter>::operator=
              ((weak_ptr<aeron::Counter> *)in_RDI,
               (weak_ptr<aeron::Counter> *)CONCAT44(__args_2,in_stack_ffffffffffffff58));
    std::weak_ptr<aeron::Counter>::~weak_ptr((weak_ptr<aeron::Counter> *)0x1c708d);
  }
  std::function<void_(aeron::concurrent::CountersReader_&,_long,_int)>::operator()
            ((function<void_(aeron::concurrent::CountersReader_&,_long,_int)> *)this_00._M_current,
             __args,(long)in_RDI,__args_2);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1c70e5);
  return;
}

Assistant:

void ClientConductor::onAvailableCounter(
    std::int64_t registrationId,
    std::int32_t counterId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto counterIt = std::find_if(m_counters.begin(), m_counters.end(),
        [registrationId](const CounterStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (counterIt != m_counters.end() && (*counterIt).m_status == RegistrationStatus::AWAITING_MEDIA_DRIVER)
    {
        CounterStateDefn& state = (*counterIt);

        state.m_status = RegistrationStatus::REGISTERED_MEDIA_DRIVER;
        state.m_counterId = counterId;
        state.m_counterCache = std::make_shared<Counter>(this, m_counterValuesBuffer, state.m_registrationId, counterId);
        state.m_counter = std::weak_ptr<Counter>(state.m_counterCache);
    }

    m_onAvailableCounterHandler(m_countersReader, registrationId, counterId);
}